

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

void XXH3_reset_internal(XXH3_state_t *statePtr,XXH64_hash_t seed,void *secret,size_t secretSize)

{
  statePtr->totalLen = 0;
  statePtr->bufferedSize = 0;
  statePtr->reserved32 = 0;
  statePtr->nbStripesSoFar = 0;
  statePtr->acc[0] = 0xc2b2ae3d;
  statePtr->acc[1] = 0x9e3779b185ebca87;
  statePtr->acc[2] = 0xc2b2ae3d27d4eb4f;
  statePtr->acc[3] = 0x165667b19e3779f9;
  statePtr->acc[4] = 0x85ebca77c2b2ae63;
  statePtr->acc[5] = 0x85ebca77;
  statePtr->acc[6] = 0x27d4eb2f165667c5;
  statePtr->acc[7] = 0x9e3779b1;
  statePtr->seed = seed;
  statePtr->extSecret = (uchar *)secret;
  statePtr->secretLimit = secretSize - 0x40;
  statePtr->nbStripesPerBlock = secretSize - 0x40 >> 3;
  return;
}

Assistant:

static void XXH3_reset_internal(XXH3_state_t* statePtr, XXH64_hash_t seed,
                                const void* secret, size_t secretSize) {
  size_t const initStart = offsetof(XXH3_state_t, bufferedSize);
  size_t const initLength =
      offsetof(XXH3_state_t, nbStripesPerBlock) - initStart;
  XXH_ASSERT(offsetof(XXH3_state_t, nbStripesPerBlock) > initStart);
  XXH_ASSERT(statePtr != NULL);
  /* set members from bufferedSize to nbStripesPerBlock (excluded) to 0 */
  memset((char*)statePtr + initStart, 0, initLength);
  statePtr->acc[0] = XXH_PRIME32_3;
  statePtr->acc[1] = XXH_PRIME64_1;
  statePtr->acc[2] = XXH_PRIME64_2;
  statePtr->acc[3] = XXH_PRIME64_3;
  statePtr->acc[4] = XXH_PRIME64_4;
  statePtr->acc[5] = XXH_PRIME32_2;
  statePtr->acc[6] = XXH_PRIME64_5;
  statePtr->acc[7] = XXH_PRIME32_1;
  statePtr->seed = seed;
  statePtr->extSecret = (const unsigned char*)secret;
  XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
  statePtr->secretLimit = secretSize - XXH_STRIPE_LEN;
  statePtr->nbStripesPerBlock = statePtr->secretLimit / XXH_SECRET_CONSUME_RATE;
}